

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

IntRect * __thiscall
ClipperLib::ClipperBase::GetBounds(IntRect *__return_storage_ptr__,ClipperBase *this)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  LocalMinima *pLVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TEdge *pTVar10;
  long lVar11;
  long lVar12;
  
  pLVar5 = this->m_MinimaList;
  if (pLVar5 != (LocalMinima *)0x0) {
    pTVar1 = pLVar5->leftBound;
    lVar8 = pTVar1->xbot;
    __return_storage_ptr__->left = lVar8;
    lVar6 = pTVar1->ybot;
    __return_storage_ptr__->top = lVar6;
    __return_storage_ptr__->right = lVar8;
    __return_storage_ptr__->bottom = lVar6;
    lVar7 = lVar6;
    lVar9 = lVar8;
    do {
      pTVar1 = pLVar5->leftBound;
      lVar12 = pTVar1->ybot;
      pTVar10 = pTVar1;
      lVar11 = lVar9;
      if (lVar6 < lVar12) {
        __return_storage_ptr__->bottom = lVar12;
        lVar6 = lVar12;
      }
      while( true ) {
        pTVar4 = pTVar10->nextInLML;
        pTVar3 = pTVar10;
        while (pTVar2 = pTVar4, pTVar2 != (TEdge *)0x0) {
          lVar12 = pTVar3->xbot;
          if (lVar12 < lVar11) {
            __return_storage_ptr__->left = lVar12;
            lVar9 = lVar12;
            lVar11 = lVar12;
            lVar12 = pTVar3->xbot;
          }
          if (lVar8 < lVar12) {
            __return_storage_ptr__->right = lVar12;
            lVar8 = lVar12;
          }
          pTVar3 = pTVar2;
          pTVar4 = pTVar2->nextInLML;
        }
        lVar12 = pTVar3->xbot;
        if (lVar12 < lVar11) {
          __return_storage_ptr__->left = lVar12;
          lVar11 = lVar12;
          lVar9 = lVar12;
          lVar12 = pTVar3->xbot;
        }
        if (lVar8 < lVar12) {
          __return_storage_ptr__->right = lVar12;
          lVar8 = lVar12;
        }
        lVar12 = pTVar3->xtop;
        if (lVar12 < lVar11) {
          __return_storage_ptr__->left = lVar12;
          lVar9 = lVar12;
          lVar11 = lVar12;
          lVar12 = pTVar3->xtop;
        }
        if (lVar8 < lVar12) {
          __return_storage_ptr__->right = lVar12;
          lVar8 = lVar12;
        }
        lVar12 = pTVar3->ytop;
        if (lVar12 < lVar7) {
          __return_storage_ptr__->top = lVar12;
          lVar7 = lVar12;
        }
        if (pTVar10 != pTVar1) break;
        pTVar10 = pLVar5->rightBound;
      }
      pLVar5 = pLVar5->next;
    } while (pLVar5 != (LocalMinima *)0x0);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->right = 0;
  __return_storage_ptr__->bottom = 0;
  __return_storage_ptr__->left = 0;
  __return_storage_ptr__->top = 0;
  return __return_storage_ptr__;
}

Assistant:

IntRect ClipperBase::GetBounds()
{
  IntRect result;
  LocalMinima* lm = m_MinimaList;
  if (!lm)
  {
    result.left = result.top = result.right = result.bottom = 0;
    return result;
  }
  result.left = lm->leftBound->xbot;
  result.top = lm->leftBound->ybot;
  result.right = lm->leftBound->xbot;
  result.bottom = lm->leftBound->ybot;
  while (lm)
  {
    if (lm->leftBound->ybot > result.bottom)
      result.bottom = lm->leftBound->ybot;
    TEdge* e = lm->leftBound;
    for (;;) {
      TEdge* bottomE = e;
      while (e->nextInLML)
      {
        if (e->xbot < result.left) result.left = e->xbot;
        if (e->xbot > result.right) result.right = e->xbot;
        e = e->nextInLML;
      }
      if (e->xbot < result.left) result.left = e->xbot;
      if (e->xbot > result.right) result.right = e->xbot;
      if (e->xtop < result.left) result.left = e->xtop;
      if (e->xtop > result.right) result.right = e->xtop;
      if (e->ytop < result.top) result.top = e->ytop;

      if (bottomE == lm->leftBound) e = lm->rightBound;
      else break;
    }
    lm = lm->next;
  }
  return result;
}